

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O3

shared_ptr<TokenStream> __thiscall
TokenStream::tokenize(TokenStream *this,ProgramContext *program,string *data_,char *stream_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ProgramContext *pPVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  TokenStream *this_00;
  int iVar6;
  const_iterator cVar7;
  ulong uVar8;
  byte *pbVar9;
  TokenStream *this_01;
  byte *pbVar10;
  undefined8 uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  byte *pbVar13;
  byte bVar14;
  Token type;
  _Alloc_hider _Var15;
  long lVar16;
  long lVar17;
  uint uVar18;
  byte *pbVar19;
  undefined4 uVar20;
  byte *pbVar21;
  undefined7 uVar23;
  undefined8 uVar22;
  byte *pbVar24;
  _Rb_tree_header *p_Var25;
  _Alloc_hider _Var26;
  bool bVar27;
  shared_ptr<TokenStream> sVar28;
  optional<std::pair<const_char_*,_size_t>_> opt_first_token_1;
  vector<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
  tokens;
  optional<std::pair<const_char_*,_size_t>_> opt_command;
  LexerContext lexer;
  undefined1 local_260 [24];
  byte *local_248;
  byte *local_240;
  optional<std::pair<const_char_*,_size_t>_> local_238;
  optional<std::pair<const_char_*,_size_t>_> local_220;
  LexerContext local_208;
  char local_140;
  byte *local_138;
  byte *pbStack_130;
  undefined4 local_124;
  size_t local_120;
  string local_118;
  long local_f8;
  ProgramContext *local_f0;
  TokenStream *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_> local_c8;
  string local_b0;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer local_50;
  pointer puStack_48;
  pointer local_40;
  size_t sStack_38;
  
  local_118._M_dataplus._M_p = (data_->_M_dataplus)._M_p;
  paVar1 = &data_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p == paVar1) {
    local_118.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_118.field_2._8_8_ = *(undefined8 *)((long)&data_->field_2 + 8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_118._M_string_length = data_->_M_string_length;
  (data_->_M_dataplus)._M_p = (pointer)paVar1;
  data_->_M_string_length = 0;
  (data_->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,stream_name,(allocator<char> *)local_260);
  LexerContext::LexerContext(&local_208,program,&local_118,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_f0 = program;
  local_e8 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_208.stream.data._M_string_length == 0) {
LAB_00191dfe:
    LexerContext::verify_nesting(&local_208);
    this_00 = local_e8;
    if (local_208.any_error == false) {
      this_01 = (TokenStream *)operator_new(0x90);
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,local_208.stream.stream_name._M_dataplus._M_p,
                 local_208.stream.stream_name._M_dataplus._M_p +
                 local_208.stream.stream_name._M_string_length);
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_208.stream.data._M_dataplus._M_p,
                 local_208.stream.data._M_dataplus._M_p + local_208.stream.data._M_string_length);
      local_50 = local_208.stream.line_offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      puStack_48 = local_208.stream.line_offset.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_40 = local_208.stream.line_offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      sStack_38 = local_208.stream.max_offset;
      local_208.stream.line_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.stream.line_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.stream.line_offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8.super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_208.tokens.
           super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_208.tokens.
           super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_c8.super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_208.tokens.
           super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_208.tokens.
      super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_208.tokens.
      super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208.tokens.
      super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TokenStream(this_01,local_f0,(TextStream *)local_90,&local_c8);
      std::__shared_ptr<TokenStream,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TokenStream,void>
                ((__shared_ptr<TokenStream,(__gnu_cxx::_Lock_policy)2> *)this_00,this_01);
      _Var12._M_pi = extraout_RDX_00;
      if (local_c8.
          super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        _Var12._M_pi = extraout_RDX_01;
      }
      if (local_50 != (pointer)0x0) {
        operator_delete(local_50,(long)local_40 - (long)local_50);
        _Var12._M_pi = extraout_RDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
        _Var12._M_pi = extraout_RDX_03;
      }
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
        _Var12._M_pi = extraout_RDX_04;
      }
    }
    else {
      (local_e8->super_enable_shared_from_this<TokenStream>)._M_weak_this.
      super___weak_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (local_e8->super_enable_shared_from_this<TokenStream>)._M_weak_this.
      super___weak_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var12._M_pi = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.line_buffer._M_dataplus._M_p != &local_208.line_buffer.field_2) {
      operator_delete(local_208.line_buffer._M_dataplus._M_p,
                      local_208.line_buffer.field_2._M_allocated_capacity + 1);
      _Var12._M_pi = extraout_RDX_05;
    }
    if (local_208.tokens.
        super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.tokens.
                      super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.tokens.
                            super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.tokens.
                            super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      _Var12._M_pi = extraout_RDX_06;
    }
    if (local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var12._M_pi = extraout_RDX_07;
    }
    if (local_208.stream.line_offset.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.stream.line_offset.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.stream.line_offset.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.stream.line_offset.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var12._M_pi = extraout_RDX_08;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.stream.data._M_dataplus._M_p != &local_208.stream.data.field_2) {
      operator_delete(local_208.stream.data._M_dataplus._M_p,
                      local_208.stream.data.field_2._M_allocated_capacity + 1);
      _Var12._M_pi = extraout_RDX_09;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.stream.stream_name._M_dataplus._M_p != &local_208.stream.stream_name.field_2) {
      operator_delete(local_208.stream.stream_name._M_dataplus._M_p,
                      local_208.stream.stream_name.field_2._M_allocated_capacity + 1);
      _Var12._M_pi = extraout_RDX_10;
    }
    sVar28.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var12._M_pi;
    sVar28.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
    return (shared_ptr<TokenStream>)
           sVar28.super___shared_ptr<TokenStream,_(__gnu_cxx::_Lock_policy)2>;
  }
  local_e0 = local_208.stream.data._M_dataplus._M_p + local_208.stream.data._M_string_length;
  local_f8 = -(long)local_208.stream.data._M_dataplus._M_p;
  local_d8 = local_208.stream.data._M_dataplus._M_p;
  _Var26._M_p = local_208.stream.data._M_dataplus._M_p;
LAB_00190282:
  local_260[0] = (allocator<char>)0xa;
  local_d0 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (_Var26._M_p,local_e0,local_260);
  local_240 = (byte *)(_Var26._M_p + -(long)local_d8);
  local_120 = (long)local_d0 - (long)local_d8;
  std::__cxx11::string::replace
            ((ulong)&local_208.line_buffer,0,(char *)local_208.line_buffer._M_string_length,
             (ulong)_Var26._M_p);
  sVar5 = local_208.line_buffer._M_string_length;
  _Var4._M_p = local_208.line_buffer._M_dataplus._M_p;
  pbVar24 = (byte *)(local_208.line_buffer._M_dataplus._M_p + local_208.line_buffer._M_string_length
                    );
  if ((char *)local_208.line_buffer._M_string_length != (char *)0x0) {
    bVar27 = false;
    _Var15._M_p = local_208.line_buffer._M_dataplus._M_p;
    do {
      bVar14 = *_Var15._M_p;
      if (local_208.comment_nest_level == 0 && bVar14 == 0x22) {
        bVar27 = (bool)(bVar27 ^ 1);
      }
      else {
        pbVar13 = (byte *)_Var15._M_p + 1;
        if (pbVar13 != pbVar24 && !bVar27) {
          if (bVar14 == 0x2a) {
            if (*pbVar13 == 0x2f) {
              if (local_208.comment_nest_level != 0) {
                local_208.comment_nest_level = local_208.comment_nest_level - 1;
                goto LAB_00190363;
              }
              local_208.any_error = true;
              local_260._16_8_ = local_240 + ((long)_Var15._M_p - (long)_Var4._M_p) + 1;
              local_260._8_8_ = local_240 + ((long)_Var15._M_p - (long)_Var4._M_p);
              local_260._0_8_ = &local_208.stream;
              ProgramContext::error<TokenStream::TokenInfo>
                        (local_208.program,(TokenInfo *)local_260,"no comment to close");
              bVar27 = false;
              _Var15._M_p = (pointer)pbVar13;
              goto LAB_00190375;
            }
          }
          else if (bVar14 == 0x2f) {
            if (*pbVar13 == 0x2a) {
              local_208.comment_nest_level = local_208.comment_nest_level + 1;
LAB_00190363:
              ((byte *)_Var15._M_p)[0] = 0x20;
              ((byte *)_Var15._M_p)[1] = 0x20;
              bVar27 = false;
              _Var15._M_p = (pointer)pbVar13;
              goto LAB_00190375;
            }
            if (*pbVar13 == 0x2f) {
              memset(_Var15._M_p,0x20,(long)pbVar24 - (long)_Var15._M_p);
              break;
            }
          }
          bVar27 = false;
        }
LAB_00190375:
        if (local_208.comment_nest_level != 0) {
          *_Var15._M_p = 0x20;
        }
      }
      _Var15._M_p = _Var15._M_p + 1;
    } while ((byte *)_Var15._M_p != pbVar24);
  }
  pbVar13 = (byte *)(local_208.line_buffer._M_dataplus._M_p + local_208.line_buffer._M_string_length
                    );
  _Var15._M_p = local_208.line_buffer._M_dataplus._M_p;
  if (0 < (long)local_208.line_buffer._M_string_length >> 2) {
    _Var15._M_p = local_208.line_buffer._M_dataplus._M_p +
                  (local_208.line_buffer._M_string_length & 0xfffffffffffffffc);
    lVar16 = ((long)local_208.line_buffer._M_string_length >> 2) + 1;
    pbVar21 = (byte *)(local_208.line_buffer._M_dataplus._M_p + 3);
    do {
      bVar14 = pbVar21[-3];
      if ((bVar14 != 0x20) && (bVar14 != 9)) {
        pbVar21 = pbVar21 + -3;
        goto LAB_001904f0;
      }
      bVar14 = pbVar21[-2];
      if ((bVar14 != 0x20) && (bVar14 != 9)) {
        pbVar21 = pbVar21 + -2;
        goto LAB_001904f0;
      }
      bVar14 = pbVar21[-1];
      if ((bVar14 != 0x20) && (bVar14 != 9)) {
        pbVar21 = pbVar21 + -1;
        goto LAB_001904f0;
      }
      bVar14 = *pbVar21;
      if ((bVar14 != 0x20) && (bVar14 != 9)) goto LAB_001904f0;
      lVar16 = lVar16 + -1;
      pbVar21 = pbVar21 + 4;
    } while (1 < lVar16);
  }
  lVar16 = (long)pbVar13 - (long)_Var15._M_p;
  if (lVar16 == 1) {
LAB_001904c2:
    bVar14 = *_Var15._M_p;
    if ((bVar14 != 9) && (pbVar21 = (byte *)_Var15._M_p, bVar14 != 0x20)) goto LAB_001904f0;
LAB_0019062b:
    if (local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] == '\0') goto LAB_00191a9e;
    _Var15._M_p = _Var4._M_p;
    if (0 < (long)sVar5 >> 2) {
      _Var15._M_p = _Var4._M_p + (sVar5 & 0xfffffffffffffffc);
      lVar16 = ((long)sVar5 >> 2) + 1;
      pbVar13 = (byte *)(_Var4._M_p + 3);
      do {
        if ((0x2c < (ulong)pbVar13[-3]) ||
           ((0x130100002200U >> ((ulong)pbVar13[-3] & 0x3f) & 1) == 0)) {
          pbVar13 = pbVar13 + -3;
          goto LAB_00190828;
        }
        if ((0x2c < (ulong)pbVar13[-2]) ||
           ((0x130100002200U >> ((ulong)pbVar13[-2] & 0x3f) & 1) == 0)) {
          pbVar13 = pbVar13 + -2;
          goto LAB_00190828;
        }
        if ((0x2c < (ulong)pbVar13[-1]) ||
           ((0x130100002200U >> ((ulong)pbVar13[-1] & 0x3f) & 1) == 0)) {
          pbVar13 = pbVar13 + -1;
          goto LAB_00190828;
        }
        if ((0x2c < (ulong)*pbVar13) || ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
        goto LAB_00190828;
        lVar16 = lVar16 + -1;
        pbVar13 = pbVar13 + 4;
      } while (1 < lVar16);
    }
    lVar16 = (long)pbVar24 - (long)_Var15._M_p;
    if (lVar16 == 1) {
LAB_00190816:
      pbVar13 = (byte *)_Var15._M_p;
      if (((ulong)(byte)*_Var15._M_p < 0x2d) &&
         ((0x130100002200U >> ((ulong)(byte)*_Var15._M_p & 0x3f) & 1) != 0)) {
        pbVar13 = pbVar24;
      }
    }
    else if (lVar16 == 2) {
LAB_00190720:
      pbVar13 = (byte *)_Var15._M_p;
      if (((ulong)(byte)*_Var15._M_p < 0x2d) &&
         ((0x130100002200U >> ((ulong)(byte)*_Var15._M_p & 0x3f) & 1) != 0)) {
        _Var15._M_p = _Var15._M_p + 1;
        goto LAB_00190816;
      }
    }
    else {
      pbVar13 = pbVar24;
      if (((lVar16 == 3) && (pbVar13 = (byte *)_Var15._M_p, (ulong)(byte)*_Var15._M_p < 0x2d)) &&
         ((0x130100002200U >> ((ulong)(byte)*_Var15._M_p & 0x3f) & 1) != 0)) {
        _Var15._M_p = _Var15._M_p + 1;
        goto LAB_00190720;
      }
    }
LAB_00190828:
    lVar16 = (long)pbVar24 - (long)pbVar13 >> 2;
    pbVar21 = pbVar24;
    if (0 < lVar16) {
      pbVar21 = (byte *)(_Var4._M_p +
                        (sVar5 - ((long)pbVar24 - (long)pbVar13 & 0xfffffffffffffffcU)));
      lVar16 = lVar16 + 1;
      do {
        if ((0x2c < (ulong)pbVar24[-1]) ||
           ((0x130100002200U >> ((ulong)pbVar24[-1] & 0x3f) & 1) == 0)) goto LAB_00190a7b;
        if ((0x2c < (ulong)pbVar24[-2]) ||
           ((0x130100002200U >> ((ulong)pbVar24[-2] & 0x3f) & 1) == 0)) {
          pbVar24 = pbVar24 + -1;
          goto LAB_00190a7b;
        }
        if ((0x2c < (ulong)pbVar24[-3]) ||
           ((0x130100002200U >> ((ulong)pbVar24[-3] & 0x3f) & 1) == 0)) {
          pbVar24 = pbVar24 + -2;
          goto LAB_00190a7b;
        }
        if ((0x2c < (ulong)pbVar24[-4]) ||
           ((0x130100002200U >> ((ulong)pbVar24[-4] & 0x3f) & 1) == 0)) {
          pbVar24 = pbVar24 + -3;
          goto LAB_00190a7b;
        }
        pbVar24 = pbVar24 + -4;
        lVar16 = lVar16 + -1;
      } while (1 < lVar16);
    }
    lVar16 = (long)pbVar21 - (long)pbVar13;
    pbVar24 = pbVar21;
    if (lVar16 == 1) {
LAB_0019091f:
      if (((ulong)pbVar24[-1] < 0x2d) && ((0x130100002200U >> ((ulong)pbVar24[-1] & 0x3f) & 1) != 0)
         ) goto LAB_00191a9e;
    }
    else if (lVar16 == 2) {
LAB_00190903:
      if (((ulong)pbVar24[-1] < 0x2d) && ((0x130100002200U >> ((ulong)pbVar24[-1] & 0x3f) & 1) != 0)
         ) {
        pbVar24 = pbVar24 + -1;
        goto LAB_0019091f;
      }
    }
    else {
      if (lVar16 != 3) goto LAB_00191a9e;
      if (((ulong)pbVar21[-1] < 0x2d) && ((0x130100002200U >> ((ulong)pbVar21[-1] & 0x3f) & 1) != 0)
         ) {
        pbVar24 = pbVar21 + -1;
        goto LAB_00190903;
      }
    }
LAB_00190a7b:
    lVar16 = (long)pbVar24 - (long)pbVar13;
    if (lVar16 == 0) goto LAB_00191a9e;
    local_248 = (byte *)_Var4._M_p;
    if (((char *)0xff < local_208.line_buffer._M_string_length) &&
       (((local_208.program)->opt).pedantic != false)) {
      local_260._16_8_ = local_240 + 1;
      local_260._0_8_ = &local_208.stream;
      local_260._8_8_ = local_240;
      ProgramContext::pedantic<TokenStream::TokenInfo>
                (local_208.program,(TokenInfo *)local_260,
                 "line is too long, miss2 only allows 255 characters [-pedantic]");
    }
    if (local_208.in_dump_mode == true) {
      lex_gettok(&local_238,(char *)pbVar13,(char *)pbVar24);
      if (((vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
            )local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ ==
           (vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
            )0x1) &&
         ((local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
           second != 7 ||
          (iVar6 = strncasecmp(local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>
                               .storage_.value_.first,"ENDDUMP",7), iVar6 != 0)))) {
        std::vector<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>::reserve
                  (&local_208.tokens,
                   ((long)local_208.tokens.
                          super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_208.tokens.
                          super__Vector_base<TokenStream::TokenData,_std::allocator<TokenStream::TokenData>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                   lVar16 / 3);
        lex_gettok(&local_220,(char *)pbVar13,(char *)pbVar24);
        if (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true) {
          local_240 = local_240 + -(long)local_248;
          lVar16 = local_f8 - (long)local_248;
          do {
            uVar22 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                     value_.first;
            pbVar13 = local_240 +
                      (long)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                            storage_.value_.first;
            if (*local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                 value_.first == 0x22) {
              pbVar21 = (byte *)lex_token(&local_208,
                                          local_220.
                                          super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>
                                          .storage_.value_.first,(char *)pbVar24,(size_t)pbVar13);
            }
            else {
              local_248 = (byte *)local_220.
                                  super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                  storage_.value_.second;
              if ((local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                   value_.second & 1) == 0) {
                uVar11 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                         storage_.value_.first;
                if (0 < (long)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                              storage_.value_.second >> 2) {
                  lVar17 = ((long)local_220.
                                  super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                  storage_.value_.second >> 2) + 1;
                  pbVar21 = (byte *)(local_220.
                                     super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                     storage_.value_.first + 3);
                  do {
                    uVar11 = pbVar21;
                    if ((9 < (int)(char)*(byte *)(uVar11 + -3) - 0x30U) &&
                       ((uVar18 = *(byte *)(uVar11 + -3) - 0x41, 0x25 < uVar18 ||
                        ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) {
                      uVar11 = uVar11 + -3;
                      goto LAB_00191030;
                    }
                    if ((9 < (int)(char)*(byte *)(uVar11 + -2) - 0x30U) &&
                       ((uVar18 = *(byte *)(uVar11 + -2) - 0x41, 0x25 < uVar18 ||
                        ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) {
                      uVar11 = uVar11 + -2;
                      goto LAB_00191030;
                    }
                    if ((9 < (int)(char)*(byte *)(uVar11 + -1) - 0x30U) &&
                       ((uVar18 = *(byte *)(uVar11 + -1) - 0x41, 0x25 < uVar18 ||
                        ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) {
                      uVar11 = uVar11 + -1;
                      goto LAB_00191030;
                    }
                    if ((9 < (int)(char)*(byte *)uVar11 - 0x30U) &&
                       ((uVar18 = *(byte *)uVar11 - 0x41, 0x25 < uVar18 ||
                        ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) goto LAB_00191030;
                    lVar17 = lVar17 + -1;
                    pbVar21 = (byte *)(uVar11 + 4);
                    uVar11 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                             storage_.value_.first +
                             (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                              storage_.value_.second & 0xfffffffffffffffc);
                  } while (1 < lVar17);
                }
                lVar17 = (long)(local_220.
                                super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_
                                .value_.first +
                               local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>
                               .storage_.value_.second) - uVar11;
                if (lVar17 == 1) {
LAB_00190dbe:
                  if ((9 < (int)(char)*(byte *)uVar11 - 0x30U) &&
                     ((uVar18 = *(byte *)uVar11 - 0x41, 0x25 < uVar18 ||
                      ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) goto LAB_00191030;
                }
                else {
                  if (lVar17 == 2) {
LAB_00190d88:
                    if (((int)(char)*(byte *)uVar11 - 0x30U < 10) ||
                       ((uVar18 = *(byte *)uVar11 - 0x41, uVar18 < 0x26 &&
                        ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) != 0)))) {
                      uVar11 = uVar11 + 1;
                      goto LAB_00190dbe;
                    }
                  }
                  else {
                    if (lVar17 != 3) goto LAB_00190df1;
                    if (((int)(char)*(byte *)uVar11 - 0x30U < 10) ||
                       ((uVar18 = *(byte *)uVar11 - 0x41, uVar18 < 0x26 &&
                        ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) != 0)))) {
                      uVar11 = uVar11 + 1;
                      goto LAB_00190d88;
                    }
                  }
LAB_00191030:
                  if ((char *)uVar11 !=
                      local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_
                      .value_.first +
                      local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_
                      .value_.second) {
                    local_208.any_error = true;
                    local_260._16_8_ =
                         local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                         storage_.value_.second + (long)pbVar13 * 2;
                    local_260._0_8_ = &local_208.stream;
                    local_260._8_8_ = pbVar13;
                    ProgramContext::error<TokenStream::TokenInfo>
                              (local_208.program,(TokenInfo *)local_260,"invalid hexadecimal token")
                    ;
                    goto LAB_00190ec2;
                  }
                }
LAB_00190df1:
                if ((byte *)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                            storage_.value_.second != (byte *)0x0) {
                  pbVar21 = (byte *)((long)pbVar13 * 2 + 2);
                  pbVar13 = (byte *)(local_220.
                                     super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                                     storage_.value_.first + (long)(_Var26._M_p + lVar16));
                  pbVar19 = (byte *)0x0;
                  do {
                    if ((((int)(char)*(byte *)(uVar22 + (long)pbVar19) - 0x30U < 10) ||
                        ((uVar18 = *(byte *)(uVar22 + (long)pbVar19) - 0x41, uVar18 < 0x26 &&
                         ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) != 0)))) &&
                       (((int)(char)((byte *)(uVar22 + 1))[(long)pbVar19] - 0x30U < 10 ||
                        ((uVar18 = ((byte *)(uVar22 + 1))[(long)pbVar19] - 0x41, uVar18 < 0x26 &&
                         ((0x3f0000003fU >> ((ulong)uVar18 & 0x3f) & 1) != 0)))))) {
                      LexerContext::add_token
                                (&local_208,Hexadecimal,(size_t)(pbVar19 + (long)pbVar13),2);
                    }
                    else {
                      local_260._8_8_ = pbVar19 + (long)pbVar13;
                      local_208.any_error = true;
                      local_260._0_8_ = &local_208.stream;
                      local_260._16_8_ = pbVar21;
                      ProgramContext::error<TokenStream::TokenInfo>
                                (local_208.program,(TokenInfo *)local_260,
                                 "invalid hexadecimal token");
                    }
                    pbVar19 = pbVar19 + 2;
                    pbVar21 = pbVar21 + 4;
                  } while (pbVar19 < local_248);
                }
              }
              else {
                local_208.any_error = true;
                local_260._16_8_ =
                     local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                     value_.second + (long)pbVar13 * 2;
                local_260._0_8_ = &local_208.stream;
                local_260._8_8_ = pbVar13;
                ProgramContext::error<TokenStream::TokenInfo>
                          (local_208.program,(TokenInfo *)local_260,
                           "hexadecimal tokens must have pairs of two digits");
              }
LAB_00190ec2:
              pbVar13 = (byte *)(uVar22 + (long)local_248);
              lVar17 = (long)pbVar24 - (long)pbVar13 >> 2;
              if (0 < lVar17) {
                pbVar13 = pbVar13 + ((long)pbVar24 - (long)pbVar13 & 0xfffffffffffffffc);
                lVar17 = lVar17 + 1;
                pbVar21 = (byte *)(uVar22 + (long)local_248) + 1;
                do {
                  if ((0x2c < (ulong)pbVar21[-1]) ||
                     ((0x130100002200U >> ((ulong)pbVar21[-1] & 0x3f) & 1) == 0)) {
                    pbVar21 = pbVar21 + -1;
                    goto LAB_00190fe9;
                  }
                  if ((0x2c < (ulong)*pbVar21) ||
                     ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0)) goto LAB_00190fe9;
                  if ((0x2c < (ulong)pbVar21[1]) ||
                     ((0x130100002200U >> ((ulong)pbVar21[1] & 0x3f) & 1) == 0)) {
                    pbVar21 = pbVar21 + 1;
                    goto LAB_00190fe9;
                  }
                  if ((0x2c < (ulong)pbVar21[2]) ||
                     ((0x130100002200U >> ((ulong)pbVar21[2] & 0x3f) & 1) == 0)) {
                    pbVar21 = pbVar21 + 2;
                    goto LAB_00190fe9;
                  }
                  lVar17 = lVar17 + -1;
                  pbVar21 = pbVar21 + 4;
                } while (1 < lVar17);
              }
              lVar17 = (long)pbVar24 - (long)pbVar13;
              if (lVar17 != 1) {
                pbVar21 = pbVar13;
                if (lVar17 != 2) {
                  pbVar21 = pbVar24;
                  if (((lVar17 != 3) || (pbVar21 = pbVar13, 0x2c < (ulong)*pbVar13)) ||
                     ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) goto LAB_00190fe9;
                  pbVar21 = pbVar13 + 1;
                }
                if ((0x2c < (ulong)*pbVar21) ||
                   ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0)) goto LAB_00190fe9;
                pbVar13 = pbVar21 + 1;
              }
              pbVar21 = pbVar13;
              if (((ulong)*pbVar13 < 0x2d) &&
                 ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)) {
                pbVar21 = pbVar24;
              }
            }
LAB_00190fe9:
            lex_gettok(&local_220,(char *)pbVar21,(char *)pbVar24);
          } while (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ !=
                   false);
        }
        LexerContext::add_token(&local_208,NewLine,local_120,0);
        goto LAB_00191a9e;
      }
    }
    lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_260,(char *)pbVar13,
               (char *)pbVar24);
    uVar11 = local_260._16_8_;
    uVar22 = local_260._8_8_;
    if ((local_260[0] == (allocator<char>)0x1) &&
       (*(byte *)(local_260._8_8_ + (long)(local_260._16_8_ - 1)) == 0x3a)) {
      LexerContext::add_token
                (&local_208,Label,(size_t)(local_260._8_8_ + ((long)local_240 - (long)local_248)),
                 local_260._16_8_);
      pbVar21 = (byte *)(uVar22 + uVar11);
      lVar17 = (long)pbVar24 - (long)pbVar21 >> 2;
      if (0 < lVar17) {
        pbVar21 = pbVar21 + ((long)pbVar24 - (long)pbVar21 & 0xfffffffffffffffc);
        lVar17 = lVar17 + 1;
        pbVar13 = (byte *)(uVar22 + (long)(uVar11 + 1));
        do {
          if ((0x2c < (ulong)pbVar13[-1]) ||
             ((0x130100002200U >> ((ulong)pbVar13[-1] & 0x3f) & 1) == 0)) {
            pbVar13 = pbVar13 + -1;
            goto LAB_001912a5;
          }
          if ((0x2c < (ulong)*pbVar13) || ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
          goto LAB_001912a5;
          if ((0x2c < (ulong)pbVar13[1]) ||
             ((0x130100002200U >> ((ulong)pbVar13[1] & 0x3f) & 1) == 0)) {
            pbVar13 = pbVar13 + 1;
            goto LAB_001912a5;
          }
          if ((0x2c < (ulong)pbVar13[2]) ||
             ((0x130100002200U >> ((ulong)pbVar13[2] & 0x3f) & 1) == 0)) {
            pbVar13 = pbVar13 + 2;
            goto LAB_001912a5;
          }
          lVar17 = lVar17 + -1;
          pbVar13 = pbVar13 + 4;
        } while (1 < lVar17);
      }
      lVar17 = (long)pbVar24 - (long)pbVar21;
      if (lVar17 != 1) {
        if (lVar17 != 2) {
          pbVar13 = pbVar24;
          if (((lVar17 != 3) || (pbVar13 = pbVar21, 0x2c < (ulong)*pbVar21)) ||
             ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0)) goto LAB_001912a5;
          pbVar21 = pbVar21 + 1;
        }
        pbVar13 = pbVar21;
        if ((0x2c < (ulong)*pbVar21) || ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0))
        goto LAB_001912a5;
        pbVar21 = pbVar21 + 1;
      }
      pbVar13 = pbVar21;
      if (((ulong)*pbVar21 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0)) {
        pbVar13 = pbVar24;
      }
    }
LAB_001912a5:
    lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_260,(char *)pbVar13,
               (char *)pbVar24);
    if (local_260[0] == (allocator<char>)0x1) {
      if ((byte *)local_260._16_8_ == (byte *)0x7) {
        iVar6 = strncasecmp((char *)local_260._8_8_,"ENDDUMP",7);
        if (iVar6 == 0) {
          local_208.in_dump_mode = false;
        }
      }
      else if (((byte *)local_260._16_8_ == (byte *)0x4) &&
              (iVar6 = strncasecmp((char *)local_260._8_8_,"DUMP",4), iVar6 == 0)) {
        local_208.in_dump_mode = true;
      }
    }
    lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_260,(char *)pbVar13,
               (char *)pbVar24);
    uVar22 = local_260._8_8_;
    if (local_260[0] == (allocator<char>)0x1) {
      uVar23 = (undefined7)((ulong)lVar16 >> 8);
      if ((byte *)local_260._16_8_ == (byte *)0x5) {
        iVar6 = strncasecmp((char *)local_260._8_8_,"WHILE",5);
        if (iVar6 != 0) goto LAB_00191379;
        LexerContext::add_token
                  (&local_208,WHILE,(size_t)(uVar22 + ((long)local_240 - (long)local_248)),5);
        pbVar21 = (byte *)(uVar22 + 5);
        lVar16 = (long)pbVar24 - (long)pbVar21 >> 2;
        if (0 < lVar16) {
          pbVar21 = pbVar21 + ((long)pbVar24 - (long)pbVar21 & 0xfffffffffffffffc);
          lVar16 = lVar16 + 1;
          pbVar13 = (byte *)(uVar22 + 8);
          do {
            if ((0x2c < (ulong)pbVar13[-3]) ||
               ((0x130100002200U >> ((ulong)pbVar13[-3] & 0x3f) & 1) == 0)) goto LAB_00191897;
            if ((0x2c < (ulong)pbVar13[-2]) ||
               ((0x130100002200U >> ((ulong)pbVar13[-2] & 0x3f) & 1) == 0)) goto LAB_001918a3;
            if ((0x2c < (ulong)pbVar13[-1]) ||
               ((0x130100002200U >> ((ulong)pbVar13[-1] & 0x3f) & 1) == 0)) goto LAB_001918af;
            if ((0x2c < (ulong)*pbVar13) || ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)
               ) goto LAB_001918b2;
            lVar16 = lVar16 + -1;
            pbVar13 = pbVar13 + 4;
          } while (1 < lVar16);
        }
LAB_001917a1:
        lVar16 = (long)pbVar24 - (long)pbVar21;
        uVar22 = CONCAT71(uVar23,1);
        if (lVar16 == 1) {
LAB_001917f0:
          if (((ulong)*pbVar21 < 0x2d) &&
             (pbVar13 = pbVar24, (0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0))
          goto LAB_00191386;
        }
        else if (lVar16 == 2) {
LAB_001917d6:
          if (((ulong)*pbVar21 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0))
          {
            pbVar21 = pbVar21 + 1;
            goto LAB_001917f0;
          }
        }
        else {
          pbVar13 = pbVar24;
          if (lVar16 != 3) goto LAB_00191386;
          if (((ulong)*pbVar21 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0))
          {
            pbVar21 = pbVar21 + 1;
            goto LAB_001917d6;
          }
        }
        pbVar13 = pbVar21;
      }
      else {
        if ((byte *)local_260._16_8_ != (byte *)0x2) goto LAB_00191379;
        iVar6 = strncasecmp((char *)local_260._8_8_,"IF",2);
        if (iVar6 == 0) {
          LexerContext::add_token
                    (&local_208,IF,(size_t)(uVar22 + ((long)local_240 - (long)local_248)),2);
          pbVar21 = (byte *)(uVar22 + 2);
          lVar16 = (long)pbVar24 - (long)pbVar21 >> 2;
          if (0 < lVar16) {
            pbVar21 = pbVar21 + ((long)pbVar24 - (long)pbVar21 & 0xfffffffffffffffc);
            lVar16 = lVar16 + 1;
            pbVar13 = (byte *)(uVar22 + 5);
            do {
              if ((0x2c < (ulong)pbVar13[-3]) ||
                 ((0x130100002200U >> ((ulong)pbVar13[-3] & 0x3f) & 1) == 0)) goto LAB_00191897;
              if ((0x2c < (ulong)pbVar13[-2]) ||
                 ((0x130100002200U >> ((ulong)pbVar13[-2] & 0x3f) & 1) == 0)) goto LAB_001918a3;
              if ((0x2c < (ulong)pbVar13[-1]) ||
                 ((0x130100002200U >> ((ulong)pbVar13[-1] & 0x3f) & 1) == 0)) goto LAB_001918af;
              if ((0x2c < (ulong)*pbVar13) ||
                 ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) goto LAB_001918b2;
              lVar16 = lVar16 + -1;
              pbVar13 = pbVar13 + 4;
            } while (1 < lVar16);
          }
          goto LAB_001917a1;
        }
        uVar22 = 0;
      }
    }
    else {
LAB_00191379:
      uVar22 = 0;
    }
    goto LAB_00191386;
  }
  if (lVar16 == 2) {
LAB_001904b2:
    bVar14 = *_Var15._M_p;
    if ((bVar14 == 0x20) || (pbVar21 = (byte *)_Var15._M_p, bVar14 == 9)) {
      _Var15._M_p = _Var15._M_p + 1;
      goto LAB_001904c2;
    }
  }
  else {
    if (lVar16 != 3) goto LAB_0019062b;
    bVar14 = *_Var15._M_p;
    if ((bVar14 == 0x20) || (pbVar21 = (byte *)_Var15._M_p, bVar14 == 9)) {
      _Var15._M_p = _Var15._M_p + 1;
      goto LAB_001904b2;
    }
  }
LAB_001904f0:
  if ((bVar14 != 0x23) || (pbVar21 == pbVar13)) goto LAB_0019062b;
  pbVar24 = local_240 + ((long)pbVar21 - (long)local_208.line_buffer._M_dataplus._M_p);
  if (((local_208.program)->opt).pedantic == true) {
    local_260._16_8_ = pbVar24 + 1;
    local_260._0_8_ = &local_208.stream;
    local_260._8_8_ = pbVar24;
    ProgramContext::pedantic<TokenStream::TokenInfo>
              (local_208.program,(TokenInfo *)local_260,
               "preprocessor is a language extension [-pedantic]");
  }
  lex_gettok(&local_220,(char *)(pbVar21 + 1),(char *)pbVar13);
  uVar11 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
           second;
  uVar22 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
           first;
  if (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true) {
    local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_ =
         (basic_string_view<char,_std::char_traits<char>_> *)0x0;
    local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.first =
         (char *)0x0;
    local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.second = 0
    ;
    local_138 = (byte *)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                        storage_.value_.first;
    pbStack_130 = (byte *)local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                          storage_.value_.second;
    local_140 = '\x01';
    do {
      if (local_140 == '\0') {
        __assert_fail("initialized()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                      ,0x1fb,
                      "T *std::experimental::optional<std::pair<const char *, unsigned long>>::operator->() [T = std::pair<const char *, unsigned long>]"
                     );
      }
      lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_260,
                 (char *)(local_138 + (long)pbStack_130),(char *)pbVar13);
      if (local_140 == '\x01') {
        if (local_260[0] == (allocator<char>)0x0) goto LAB_00190742;
      }
      else {
        if (local_260[0] == (allocator<char>)0x0) goto LAB_0019074a;
        local_140 = '\x01';
      }
      pbStack_130 = (byte *)local_260._16_8_;
      local_138 = (byte *)local_260._8_8_;
      std::
      vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<char_const*&,unsigned_long&>
                ((vector<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,std::allocator<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>>
                  *)&local_238,(char **)&local_138,(unsigned_long *)&pbStack_130);
    } while( true );
  }
  goto LAB_00191a9e;
LAB_00191897:
  pbVar13 = pbVar13 + -3;
  goto LAB_001918b2;
LAB_001918a3:
  pbVar13 = pbVar13 + -2;
  goto LAB_001918b2;
LAB_001918af:
  pbVar13 = pbVar13 + -1;
LAB_001918b2:
  uVar22 = CONCAT71(uVar23,1);
LAB_00191386:
  lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_260,(char *)pbVar13,(char *)pbVar24
            );
  uVar11 = local_260._8_8_;
  if (local_260[0] == (allocator<char>)0x1) {
    uVar23 = (undefined7)((ulong)uVar22 >> 8);
    if ((byte *)local_260._16_8_ == (byte *)0x2) {
      iVar6 = strncasecmp((char *)local_260._8_8_,"OR",2);
      if (iVar6 == 0) {
        LexerContext::add_token
                  (&local_208,OR,(size_t)(uVar11 + ((long)local_240 - (long)local_248)),2);
        pbVar21 = (byte *)(uVar11 + 2);
        lVar16 = (long)pbVar24 - (long)pbVar21 >> 2;
        if (0 < lVar16) {
          pbVar21 = pbVar21 + ((long)pbVar24 - (long)pbVar21 & 0xfffffffffffffffc);
          lVar16 = lVar16 + 1;
          pbVar13 = (byte *)(uVar11 + 5);
          do {
            if ((0x2c < (ulong)pbVar13[-3]) ||
               ((0x130100002200U >> ((ulong)pbVar13[-3] & 0x3f) & 1) == 0)) goto LAB_0019189d;
            if ((0x2c < (ulong)pbVar13[-2]) ||
               ((0x130100002200U >> ((ulong)pbVar13[-2] & 0x3f) & 1) == 0)) goto LAB_001918a9;
            if ((0x2c < (ulong)pbVar13[-1]) ||
               ((0x130100002200U >> ((ulong)pbVar13[-1] & 0x3f) & 1) == 0)) goto LAB_001918ba;
            if ((0x2c < (ulong)*pbVar13) || ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)
               ) goto LAB_001918bd;
            lVar16 = lVar16 + -1;
            pbVar13 = pbVar13 + 4;
          } while (1 < lVar16);
        }
        goto LAB_00191816;
      }
    }
    else if (((byte *)local_260._16_8_ == (byte *)0x3) &&
            (iVar6 = strncasecmp((char *)local_260._8_8_,"AND",3), iVar6 == 0)) {
      LexerContext::add_token
                (&local_208,AND,(size_t)(uVar11 + ((long)local_240 - (long)local_248)),3);
      pbVar21 = (byte *)(uVar11 + 3);
      lVar16 = (long)pbVar24 - (long)pbVar21 >> 2;
      if (0 < lVar16) {
        pbVar21 = pbVar21 + ((long)pbVar24 - (long)pbVar21 & 0xfffffffffffffffc);
        lVar16 = lVar16 + 1;
        pbVar13 = (byte *)(uVar11 + 6);
        do {
          if ((0x2c < (ulong)pbVar13[-3]) ||
             ((0x130100002200U >> ((ulong)pbVar13[-3] & 0x3f) & 1) == 0)) goto LAB_0019189d;
          if ((0x2c < (ulong)pbVar13[-2]) ||
             ((0x130100002200U >> ((ulong)pbVar13[-2] & 0x3f) & 1) == 0)) goto LAB_001918a9;
          if ((0x2c < (ulong)pbVar13[-1]) ||
             ((0x130100002200U >> ((ulong)pbVar13[-1] & 0x3f) & 1) == 0)) goto LAB_001918ba;
          if ((0x2c < (ulong)*pbVar13) || ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
          goto LAB_001918bd;
          lVar16 = lVar16 + -1;
          pbVar13 = pbVar13 + 4;
        } while (1 < lVar16);
      }
LAB_00191816:
      lVar16 = (long)pbVar24 - (long)pbVar21;
      uVar22 = CONCAT71(uVar23,1);
      if (lVar16 == 1) {
LAB_00191855:
        if (((ulong)*pbVar21 < 0x2d) &&
           (pbVar13 = pbVar24, (0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0))
        goto LAB_001918c0;
      }
      else if (lVar16 == 2) {
LAB_00191843:
        if (((ulong)*pbVar21 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0)) {
          pbVar21 = pbVar21 + 1;
          goto LAB_00191855;
        }
      }
      else {
        pbVar13 = pbVar24;
        if (lVar16 != 3) goto LAB_001918c0;
        if (((ulong)*pbVar21 < 0x2d) && ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0)) {
          pbVar21 = pbVar21 + 1;
          goto LAB_00191843;
        }
      }
      pbVar13 = pbVar21;
    }
  }
  goto LAB_001918c0;
LAB_0019189d:
  pbVar13 = pbVar13 + -3;
  goto LAB_001918bd;
LAB_001918a9:
  pbVar13 = pbVar13 + -2;
  goto LAB_001918bd;
LAB_001918ba:
  pbVar13 = pbVar13 + -1;
LAB_001918bd:
  uVar22 = CONCAT71(uVar23,1);
LAB_001918c0:
  uVar20 = (undefined4)uVar22;
  lex_gettok((optional<std::pair<const_char_*,_size_t>_> *)local_260,(char *)pbVar13,(char *)pbVar24
            );
  uVar11 = local_260._8_8_;
  if (((local_260[0] == (allocator<char>)0x1) && ((byte *)local_260._16_8_ == (byte *)0x3)) &&
     (iVar6 = strncasecmp((char *)local_260._8_8_,"NOT",3), iVar6 == 0)) {
    LexerContext::add_token(&local_208,NOT,(size_t)(uVar11 + ((long)local_240 - (long)local_248)),3)
    ;
    pbVar13 = (byte *)(uVar11 + 3);
    lVar16 = (long)pbVar24 - (long)pbVar13 >> 2;
    uVar23 = (undefined7)((ulong)uVar22 >> 8);
    if (0 < lVar16) {
      pbVar13 = pbVar13 + ((long)pbVar24 - (long)pbVar13 & 0xfffffffffffffffc);
      lVar16 = lVar16 + 1;
      pbVar21 = (byte *)(uVar11 + 6);
      do {
        if ((0x2c < (ulong)pbVar21[-3]) ||
           ((0x130100002200U >> ((ulong)pbVar21[-3] & 0x3f) & 1) == 0)) {
          pbVar21 = pbVar21 + -3;
LAB_00191b93:
          uVar20 = (undefined4)CONCAT71(uVar23,1);
          pbVar13 = pbVar21;
          goto LAB_00191a41;
        }
        if ((0x2c < (ulong)pbVar21[-2]) ||
           ((0x130100002200U >> ((ulong)pbVar21[-2] & 0x3f) & 1) == 0)) {
          pbVar21 = pbVar21 + -2;
          goto LAB_00191b93;
        }
        if ((0x2c < (ulong)pbVar21[-1]) ||
           ((0x130100002200U >> ((ulong)pbVar21[-1] & 0x3f) & 1) == 0)) {
          pbVar21 = pbVar21 + -1;
          goto LAB_00191b93;
        }
        if ((0x2c < (ulong)*pbVar21) || ((0x130100002200U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0))
        goto LAB_00191b93;
        lVar16 = lVar16 + -1;
        pbVar21 = pbVar21 + 4;
      } while (1 < lVar16);
    }
    lVar16 = (long)pbVar24 - (long)pbVar13;
    if (lVar16 == 1) {
LAB_00191b5d:
      uVar20 = (undefined4)CONCAT71((int7)((ulong)uVar22 >> 8),1);
      if ((0x2c < (ulong)*pbVar13) || ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
      goto LAB_00191a41;
    }
    else {
      if (lVar16 == 2) {
LAB_00191a17:
        uVar22 = CONCAT71((int7)((ulong)uVar22 >> 8),1);
        uVar20 = (undefined4)uVar22;
        if ((0x2c < (ulong)*pbVar13) || ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
        goto LAB_00191a41;
        pbVar13 = pbVar13 + 1;
        goto LAB_00191b5d;
      }
      if (lVar16 == 3) {
        uVar22 = CONCAT71(uVar23,1);
        uVar20 = (undefined4)uVar22;
        if ((0x2c < (ulong)*pbVar13) || ((0x130100002200U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0))
        goto LAB_00191a41;
        pbVar13 = pbVar13 + 1;
        goto LAB_00191a17;
      }
    }
  }
  else {
LAB_00191a41:
    if (pbVar13 == pbVar24) {
      if ((char)uVar20 == '\0') goto LAB_00191a9e;
    }
    else {
      uVar8 = (ulong)*pbVar13;
      pbVar19 = pbVar13;
      pbVar21 = pbVar13;
      if ((uVar8 < 0x3f) &&
         (((0x70008c0000000000U >> (uVar8 & 0x3f) & 1) != 0 ||
          ((uVar8 == 0x2d &&
           ((pbVar13 + 1 == pbVar24 ||
            (bVar14 = pbVar13[1], bVar14 != 0x2e && 9 < (byte)(bVar14 - 0x30))))))))) {
LAB_00191a63:
        lex_expr(&local_208,(char *)pbVar13,(char *)pbVar24,
                 (size_t)(pbVar13 + ((long)local_240 - (long)local_248)));
      }
      else {
        do {
          pbVar10 = pbVar21 + 1;
          uVar8 = (ulong)*pbVar21;
          if (uVar8 < 0x3f) {
            pbVar9 = pbVar19;
            if (uVar8 == 0x2d) {
              if ((pbVar10 == pbVar24) ||
                 (pbVar9 = pbVar21, *pbVar10 != 0x2e && 9 < (byte)(*pbVar10 - 0x30))) break;
            }
            else if ((0x70009f0100002200U >> (uVar8 & 0x3f) & 1) != 0) break;
          }
          pbVar9 = pbVar24;
          pbVar19 = pbVar19 + 1;
          pbVar21 = pbVar10;
        } while (pbVar10 != pbVar24);
        lVar16 = (long)pbVar24 - (long)pbVar9 >> 2;
        pbVar21 = pbVar9;
        if (0 < lVar16) {
          pbVar21 = pbVar9 + ((long)pbVar24 - (long)pbVar9 & 0xfffffffffffffffc);
          lVar16 = lVar16 + 1;
          pbVar9 = pbVar9 + 3;
          do {
            uVar8 = (ulong)pbVar9[-3];
            if ((0x2c < uVar8) || ((0x130100002200U >> (uVar8 & 0x3f) & 1) == 0)) {
              pbVar9 = pbVar9 + -3;
              goto LAB_00191c84;
            }
            uVar8 = (ulong)pbVar9[-2];
            if ((0x2c < uVar8) || ((0x130100002200U >> (uVar8 & 0x3f) & 1) == 0)) {
              pbVar9 = pbVar9 + -2;
              goto LAB_00191c84;
            }
            uVar8 = (ulong)pbVar9[-1];
            if ((0x2c < uVar8) || ((0x130100002200U >> (uVar8 & 0x3f) & 1) == 0)) {
              pbVar9 = pbVar9 + -1;
              goto LAB_00191c84;
            }
            uVar8 = (ulong)*pbVar9;
            if ((0x2c < uVar8) || ((0x130100002200U >> (uVar8 & 0x3f) & 1) == 0)) goto LAB_00191c84;
            lVar16 = lVar16 + -1;
            pbVar9 = pbVar9 + 4;
          } while (1 < lVar16);
        }
        lVar16 = (long)pbVar24 - (long)pbVar21;
        pbVar9 = pbVar21;
        if (lVar16 == 1) {
LAB_00191c64:
          uVar8 = (ulong)*pbVar9;
          if ((0x2c < uVar8) || ((0x130100002200U >> (uVar8 & 0x3f) & 1) == 0)) goto LAB_00191c84;
        }
        else {
          if (lVar16 == 2) {
LAB_00191c52:
            uVar8 = (ulong)*pbVar9;
            if ((uVar8 < 0x2d) && ((0x130100002200U >> (uVar8 & 0x3f) & 1) != 0)) {
              pbVar9 = pbVar9 + 1;
              goto LAB_00191c64;
            }
          }
          else {
            if (lVar16 != 3) goto LAB_00191ccd;
            uVar8 = (ulong)*pbVar21;
            if ((uVar8 < 0x2d) && ((0x130100002200U >> (uVar8 & 0x3f) & 1) != 0)) {
              pbVar9 = pbVar21 + 1;
              goto LAB_00191c52;
            }
          }
LAB_00191c84:
          if (((pbVar9 != pbVar24) && ((byte)uVar8 < 0x3f)) &&
             (((0x70008c0000000000U >> (uVar8 & 0x3f) & 1) != 0 ||
              ((uVar8 == 0x2d &&
               ((pbVar9 + 1 == pbVar24 ||
                (bVar14 = pbVar9[1], 9 < (byte)(bVar14 - 0x30) && bVar14 != 0x2e))))))))
          goto LAB_00191a63;
        }
LAB_00191ccd:
        lex_gettok(&local_220,(char *)pbVar13,(char *)pbVar24);
        uVar11 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                 value_.second;
        uVar22 = local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                 value_.first;
        if (local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.init_ == true) {
          local_240 = local_240 + ((long)pbVar13 - (long)local_248);
          pbVar21 = (byte *)(local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                             storage_.value_.first +
                            local_220.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                            storage_.value_.second);
          lVar16 = 0x10;
          local_124 = uVar20;
          do {
            if (((byte *)uVar11 == *(byte **)((long)&expr_symbols[0x13].second + lVar16)) &&
               (iVar6 = strncasecmp((char *)uVar22,
                                    *(char **)((long)&expr_symbols[0x13].first.__size + lVar16),
                                    uVar11), iVar6 == 0)) {
              pbVar19 = local_240 + (uVar22 - (long)pbVar13);
              if ((char)local_124 != '\0') {
                local_208.any_error = true;
                local_260._16_8_ = pbVar19 + uVar11;
                local_260._0_8_ = &local_208.stream;
                local_260._8_8_ = pbVar19;
                local_248 = pbVar19;
                ProgramContext::error<TokenStream::TokenInfo>
                          (local_208.program,(TokenInfo *)local_260,"unexpected token");
                pbVar19 = local_248;
              }
              type = *(Token *)((long)&keycommands[0].first.__data + lVar16);
              goto LAB_00191dbc;
            }
            lVar16 = lVar16 + 0x18;
          } while (lVar16 != 0x2c8);
          pbVar19 = (byte *)(uVar22 + ((long)local_240 - (long)pbVar13));
          type = Command;
LAB_00191dbc:
          LexerContext::add_token(&local_208,type,(size_t)pbVar19,uVar11);
          if (pbVar21 != pbVar24) {
            lVar16 = (long)local_240 - (long)pbVar13;
            do {
              pbVar21 = (byte *)lex_token(&local_208,(char *)pbVar21,(char *)pbVar24,
                                          (size_t)(pbVar21 + lVar16));
            } while (pbVar21 != pbVar24);
          }
        }
      }
    }
  }
  LexerContext::add_token(&local_208,NewLine,local_120,0);
LAB_00191a9e:
  _Var26._M_p = local_d0 + (local_d0 != local_e0);
  if (_Var26._M_p == local_e0) goto LAB_00191dfe;
  goto LAB_00190282;
LAB_00190742:
  local_140 = '\0';
LAB_0019074a:
  if ((byte *)uVar11 == (byte *)0x4) {
    if (*(int *)uVar22 != 0x65736c65) goto LAB_001909f7;
    if (local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.first
        != (char *)local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_) {
      local_208.any_error = true;
      local_260._16_8_ = pbVar24 + 1;
      local_260._0_8_ = &local_208.stream;
      local_260._8_8_ = pbVar24;
      ProgramContext::error<TokenStream::TokenInfo>
                (local_208.program,(TokenInfo *)local_260,
                 "too many tokens in preprocessor directive");
    }
    if ((ulong)((long)local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start) < 2) {
      local_208.any_error = true;
      local_260._0_8_ = &local_208.stream;
      local_260._16_8_ = pbVar24 + 1;
      local_260._8_8_ = pbVar24;
      ProgramContext::error<TokenStream::TokenInfo>
                (local_208.program,(TokenInfo *)local_260,"#else without #ifdef");
    }
    else if (local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start
             [((long)local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start) - 2] != '\0') {
      local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish[-1] =
           local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish[-1] == '\0';
    }
  }
  else {
    if ((byte *)uVar11 == (byte *)0x6) {
      if (*(short *)(uVar22 + 4) == 0x6665 && *(int *)uVar22 == 0x646e6669) {
LAB_0019095a:
        if ((long)local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                  value_.first -
            local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_ != 0x10) {
          local_208.any_error = true;
          local_260._0_8_ = &local_208.stream;
          local_260._16_8_ = pbVar24 + 1;
          local_260._8_8_ = pbVar24;
          ProgramContext::error<TokenStream::TokenInfo>
                    (local_208.program,(TokenInfo *)local_260,
                     "wrong number of tokens in preprocessor directive");
        }
        pPVar3 = local_208.program;
        if (local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
            first == (char *)local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                             _0_8_) goto LAB_00190a2a;
        cVar2 = local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
        cVar7 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::
                _M_find_tr<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>,void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)&((local_208.program)->opt).defines,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                           _0_8_);
        p_Var25 = &(pPVar3->opt).defines._M_t._M_impl.super__Rb_tree_header;
        if (*(byte *)(uVar22 + 2) == 0x6e) {
          if ((_Rb_tree_header *)cVar7._M_node == p_Var25) goto LAB_0019120a;
LAB_001909e3:
          bVar27 = false;
        }
        else {
          if ((_Rb_tree_header *)cVar7._M_node == p_Var25) goto LAB_001909e3;
LAB_0019120a:
          bVar27 = cVar2 != '\0';
        }
        local_260[0] = (allocator<char>)bVar27;
        std::vector<char,_std::allocator<char>_>::emplace_back<bool>
                  (&local_208.cpp_stack,(bool *)local_260);
        goto LAB_00190a2a;
      }
    }
    else if ((byte *)uVar11 == (byte *)0x5) {
      if (*(byte *)(uVar22 + 4) == 0x66 && *(int *)uVar22 == 0x65646669) goto LAB_0019095a;
      if (*(byte *)(uVar22 + 4) == 0x66 && *(int *)uVar22 == 0x69646e65) {
        if (local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.value_.
            first != (char *)local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                             _0_8_) {
          local_208.any_error = true;
          local_260._16_8_ = pbVar24 + 1;
          local_260._0_8_ = &local_208.stream;
          local_260._8_8_ = pbVar24;
          ProgramContext::error<TokenStream::TokenInfo>
                    (local_208.program,(TokenInfo *)local_260,
                     "too many tokens in preprocessor directive");
        }
        if ((ulong)((long)local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl
                         .super__Vector_impl_data._M_start) < 2) {
          local_208.any_error = true;
          local_260._0_8_ = &local_208.stream;
          local_260._16_8_ = pbVar24 + 1;
          local_260._8_8_ = pbVar24;
          ProgramContext::error<TokenStream::TokenInfo>
                    (local_208.program,(TokenInfo *)local_260,"#endif without #ifdef");
        }
        else {
          local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_208.cpp_stack.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
        }
        goto LAB_00190a2a;
      }
    }
LAB_001909f7:
    local_208.any_error = true;
    local_260._0_8_ = &local_208.stream;
    local_260._16_8_ = pbVar24 + 1;
    local_260._8_8_ = pbVar24;
    ProgramContext::error<TokenStream::TokenInfo>
              (local_208.program,(TokenInfo *)local_260,"unknown preprocessor directive");
  }
LAB_00190a2a:
  if ((basic_string_view<char,_std::char_traits<char>_> *)
      local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_ !=
      (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    operator_delete((void *)local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.
                            _0_8_,
                    local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>.storage_.
                    value_.second -
                    local_238.super_OptionalBase<std::pair<const_char_*,_unsigned_long>_>._0_8_);
  }
  goto LAB_00191a9e;
}

Assistant:

std::shared_ptr<TokenStream> TokenStream::tokenize(ProgramContext& program, std::string data_, const char* stream_name)
{
    LexerContext lexer(program, std::move(data_), stream_name);

    auto begin = lexer.stream.data.c_str();
    auto end = lexer.stream.data.c_str() + lexer.stream.data.size();

    for(auto it = begin; it != end; )
    {
        const char *line_start = it;
        const char *line_end   = std::find(it, end, '\n');

        lex_line(lexer, begin, std::distance(begin, line_start), std::distance(begin, line_end));
        it = (line_end == end? line_end : std::next(line_end));
    }

    lexer.verify_nesting();

    if(!lexer.any_error)
        return shared_ptr<TokenStream>(new TokenStream(program, std::move(lexer.stream), std::move(lexer.tokens)));
    else
        return nullptr;
}